

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<unsigned_int> *
wasm::WATParser::tupleArity<wasm::WATParser::NullCtx>
          (Result<unsigned_int> *__return_storage_ptr__,NullCtx *ctx)

{
  undefined8 *puVar1;
  optional<unsigned_int> oVar2;
  _Alloc_hider _Var3;
  string local_80;
  string local_60;
  Err local_40;
  
  oVar2 = Lexer::takeU<unsigned_int>(&ctx->in);
  if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"expected tuple arity","");
    Lexer::err(&local_40,&ctx->in,&local_80);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.msg._M_dataplus._M_p == &local_40.msg.field_2) {
      *puVar1 = CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                         local_40.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x18) =
           local_40.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = local_40.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                        super__Move_assign_alias<unsigned_int,_wasm::Err>.
                        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10) =
           CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                    local_40.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 8) =
         local_40.msg._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\x01';
    local_60.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    _Var3._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (1 < oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload) {
      *(uint *)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                super__Move_assign_alias<unsigned_int,_wasm::Err>.
                super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                super__Variant_storage_alias<unsigned_int,_wasm::Err> =
           oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"tuple arity must be at least 2","");
    Lexer::err(&local_40,&ctx->in,&local_60);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.msg._M_dataplus._M_p == &local_40.msg.field_2) {
      *puVar1 = CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                         local_40.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x18) =
           local_40.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = local_40.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                        super__Move_assign_alias<unsigned_int,_wasm::Err>.
                        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10) =
           CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                    local_40.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 8) =
         local_40.msg._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\x01';
    _Var3._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
  }
  local_40.msg._M_dataplus._M_p = (pointer)&local_40.msg.field_2;
  local_40.msg.field_2._M_local_buf[0] = '\0';
  local_40.msg._M_string_length = 0;
  operator_delete(_Var3._M_p,local_60.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> tupleArity(Ctx& ctx) {
  auto arity = ctx.in.takeU32();
  if (!arity) {
    return ctx.in.err("expected tuple arity");
  }
  if (*arity < 2) {
    return ctx.in.err("tuple arity must be at least 2");
  }
  return *arity;
}